

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

char * ini_property_name(ini_t *ini,int section,int property)

{
  int iVar1;
  ini_t *local_30;
  int p;
  int property_local;
  int section_local;
  ini_t *ini_local;
  
  if ((((ini == (ini_t *)0x0) || (section < 0)) || (ini->section_count <= section)) ||
     (iVar1 = ini_internal_property_index(ini,section,property), iVar1 == -1)) {
    ini_local = (ini_t *)0x0;
  }
  else {
    if (ini->properties[iVar1].name_large == (char *)0x0) {
      local_30 = (ini_t *)ini->properties[iVar1].name;
    }
    else {
      local_30 = (ini_t *)ini->properties[iVar1].name_large;
    }
    ini_local = local_30;
  }
  return (char *)ini_local;
}

Assistant:

char const* ini_property_name( ini_t const* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            return ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
        }

    return NULL;
    }